

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

void Abc_NtkTimeScale(Abc_Ntk_t *pNtk,float Scale)

{
  undefined8 uVar1;
  Abc_ManTime_t *pAVar2;
  void **ppvVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  float fVar6;
  float fVar7;
  long lVar8;
  long lVar9;
  
  pAVar2 = pNtk->pManTime;
  if (pAVar2 != (Abc_ManTime_t *)0x0) {
    fVar6 = (pAVar2->tReqDef).Rise;
    fVar7 = (pAVar2->tReqDef).Fall;
    (pAVar2->tArrDef).Rise = (pAVar2->tArrDef).Rise * Scale;
    (pAVar2->tArrDef).Fall = (pAVar2->tArrDef).Fall * Scale;
    (pAVar2->tReqDef).Rise = fVar6 * Scale;
    (pAVar2->tReqDef).Fall = fVar7 * Scale;
    lVar8 = (long)pNtk->vCis->nSize;
    if (0 < lVar8) {
      ppvVar3 = pAVar2->vArrs->pArray;
      ppvVar4 = pNtk->vCis->pArray;
      lVar9 = 0;
      do {
        puVar5 = (undefined8 *)ppvVar3[*(int *)((long)ppvVar4[lVar9] + 0x10)];
        uVar1 = *puVar5;
        *puVar5 = CONCAT44((float)((ulong)uVar1 >> 0x20) * Scale,(float)uVar1 * Scale);
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
    lVar8 = (long)pNtk->vCos->nSize;
    if (0 < lVar8) {
      ppvVar3 = pAVar2->vReqs->pArray;
      ppvVar4 = pNtk->vCos->pArray;
      lVar9 = 0;
      do {
        puVar5 = (undefined8 *)ppvVar3[*(int *)((long)ppvVar4[lVar9] + 0x10)];
        uVar1 = *puVar5;
        *puVar5 = CONCAT44((float)((ulong)uVar1 >> 0x20) * Scale,(float)uVar1 * Scale);
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
  }
  return;
}

Assistant:

void Abc_NtkTimeScale( Abc_Ntk_t * pNtk, float Scale )
{
    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimes, * pTime;
    int i;
    if ( pNtk->pManTime == NULL )
        return;
    // arrival
    pNtk->pManTime->tArrDef.Fall *= Scale;
    pNtk->pManTime->tArrDef.Rise *= Scale;
    // departure
    pNtk->pManTime->tReqDef.Fall *= Scale;
    pNtk->pManTime->tReqDef.Rise *= Scale;
    // set the default timing
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vArrs->pArray;
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall *= Scale;
        pTime->Rise *= Scale;
    }
    // set the default timing
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vReqs->pArray;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall *= Scale;
        pTime->Rise *= Scale;
    }
}